

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Print.cpp
# Opt level: O0

void __thiscall celero::Printer::TableResult(Printer *this,shared_ptr<celero::ExperimentResult> *x)

{
  __node_base_ptr *__return_storage_ptr__;
  value_type *pvVar1;
  bool bVar2;
  element_type *peVar3;
  int64_t x_00;
  element_type *this_00;
  value_type *pvVar4;
  mapped_type *pmVar5;
  reference pvVar6;
  double dVar7;
  string local_1b8;
  allocator local_191;
  string local_190;
  string local_170;
  _Node_iterator_base<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_double>,_true>
  local_150;
  _Node_iterator_base<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_double>,_true>
  local_148;
  reference local_140;
  value_type *fieldName;
  size_t i;
  pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_double>
  *entry;
  iterator __end1;
  iterator __begin1;
  vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_double>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_double>_>_>
  *__range1;
  shared_ptr<celero::UserDefinedMeasurementCollector> udmCollector;
  unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_double,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_double>_>_>
  udmValues;
  string local_90;
  string local_70;
  string local_40;
  ConsoleColor local_1c;
  shared_ptr<celero::ExperimentResult> *psStack_18;
  ConsoleColor temp_color;
  shared_ptr<celero::ExperimentResult> *x_local;
  Printer *this_local;
  
  psStack_18 = x;
  x_local = (shared_ptr<celero::ExperimentResult> *)this;
  console::SetConsoleColor(Default);
  peVar3 = std::
           __shared_ptr_access<celero::ExperimentResult,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
           operator->((__shared_ptr_access<celero::ExperimentResult,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                       *)x);
  dVar7 = ExperimentResult::getBaselineMeasurement(peVar3);
  if (dVar7 <= 1.0) {
    peVar3 = std::
             __shared_ptr_access<celero::ExperimentResult,_(__gnu_cxx::_Lock_policy)2,_false,_false>
             ::operator->((__shared_ptr_access<celero::ExperimentResult,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                           *)x);
    dVar7 = ExperimentResult::getBaselineMeasurement(peVar3);
    if (1.0 <= dVar7) {
      local_1c = Cyan;
    }
    else {
      local_1c = Green;
    }
  }
  else {
    local_1c = Yellow;
  }
  console::SetConsoleColor(local_1c);
  peVar3 = std::
           __shared_ptr_access<celero::ExperimentResult,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
           operator->((__shared_ptr_access<celero::ExperimentResult,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                       *)x);
  dVar7 = ExperimentResult::getBaselineMeasurement(peVar3);
  PrintColumn_abi_cxx11_(&local_40,dVar7,5,0xf);
  std::operator<<((ostream *)&std::cout,(string *)&local_40);
  std::__cxx11::string::~string((string *)&local_40);
  console::SetConsoleColor(Default);
  console::SetConsoleColor(local_1c);
  peVar3 = std::
           __shared_ptr_access<celero::ExperimentResult,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
           operator->((__shared_ptr_access<celero::ExperimentResult,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                       *)x);
  dVar7 = ExperimentResult::getUsPerCall(peVar3);
  PrintColumn_abi_cxx11_(&local_70,dVar7,5,0xf);
  std::operator<<((ostream *)&std::cout,(string *)&local_70);
  std::__cxx11::string::~string((string *)&local_70);
  console::SetConsoleColor(Default);
  console::SetConsoleColor(local_1c);
  peVar3 = std::
           __shared_ptr_access<celero::ExperimentResult,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
           operator->((__shared_ptr_access<celero::ExperimentResult,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                       *)x);
  dVar7 = ExperimentResult::getCallsPerSecond(peVar3);
  PrintColumn_abi_cxx11_(&local_90,dVar7,2,0xf);
  std::operator<<((ostream *)&std::cout,(string *)&local_90);
  std::__cxx11::string::~string((string *)&local_90);
  console::SetConsoleColor(Default);
  console::SetConsoleColor(local_1c);
  peVar3 = std::
           __shared_ptr_access<celero::ExperimentResult,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
           operator->((__shared_ptr_access<celero::ExperimentResult,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                       *)x);
  x_00 = ExperimentResult::getRAM(peVar3);
  __return_storage_ptr__ = &udmValues._M_h._M_single_bucket;
  PrintColumn_abi_cxx11_((string *)__return_storage_ptr__,x_00,0xf);
  std::operator<<((ostream *)&std::cout,(string *)__return_storage_ptr__);
  std::__cxx11::string::~string((string *)&udmValues._M_h._M_single_bucket);
  console::SetConsoleColor(Default);
  std::
  unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_double,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_double>_>_>
  ::unordered_map((unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_double,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_double>_>_>
                   *)&udmCollector.
                      super___shared_ptr<celero::UserDefinedMeasurementCollector,_(__gnu_cxx::_Lock_policy)2>
                      ._M_refcount);
  std::__shared_ptr_access<celero::ExperimentResult,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
  operator->((__shared_ptr_access<celero::ExperimentResult,_(__gnu_cxx::_Lock_policy)2,_false,_false>
              *)x);
  ExperimentResult::getUserDefinedMeasurements((ExperimentResult *)&__range1);
  this_00 = std::
            __shared_ptr_access<celero::UserDefinedMeasurementCollector,_(__gnu_cxx::_Lock_policy)2,_false,_false>
            ::operator->((__shared_ptr_access<celero::UserDefinedMeasurementCollector,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                          *)&__range1);
  UserDefinedMeasurementCollector::getAggregateValues_abi_cxx11_
            ((vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_double>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_double>_>_>
              *)&__begin1,this_00);
  __end1 = std::
           vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_double>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_double>_>_>
           ::begin((vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_double>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_double>_>_>
                    *)&__begin1);
  entry = (pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_double>
           *)std::
             vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_double>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_double>_>_>
             ::end((vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_double>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_double>_>_>
                    *)&__begin1);
  while (bVar2 = __gnu_cxx::operator!=
                           (&__end1,(__normal_iterator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_double>_*,_std::vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_double>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_double>_>_>_>
                                     *)&entry), bVar2) {
    i = (size_t)__gnu_cxx::
                __normal_iterator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_double>_*,_std::vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_double>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_double>_>_>_>
                ::operator*(&__end1);
    dVar7 = ((reference)i)->second;
    pmVar5 = std::
             unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_double,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_double>_>_>
             ::operator[]((unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_double,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_double>_>_>
                           *)&udmCollector.
                              super___shared_ptr<celero::UserDefinedMeasurementCollector,_(__gnu_cxx::_Lock_policy)2>
                              ._M_refcount,(key_type *)i);
    *pmVar5 = dVar7;
    __gnu_cxx::
    __normal_iterator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_double>_*,_std::vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_double>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_double>_>_>_>
    ::operator++(&__end1);
  }
  std::
  vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_double>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_double>_>_>
  ::~vector((vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_double>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_double>_>_>
             *)&__begin1);
  for (fieldName = (value_type *)0x0; pvVar1 = fieldName,
      pvVar4 = (value_type *)
               std::
               vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               ::size(&this->userDefinedColumns), pvVar1 < pvVar4;
      fieldName = (value_type *)&fieldName->field_0x1) {
    local_140 = std::
                vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                ::operator[](&this->userDefinedColumns,(size_type)fieldName);
    local_148._M_cur =
         (__node_type *)
         std::
         unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_double,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_double>_>_>
         ::find((unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_double,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_double>_>_>
                 *)&udmCollector.
                    super___shared_ptr<celero::UserDefinedMeasurementCollector,_(__gnu_cxx::_Lock_policy)2>
                    ._M_refcount,local_140);
    local_150._M_cur =
         (__node_type *)
         std::
         unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_double,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_double>_>_>
         ::end((unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_double,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_double>_>_>
                *)&udmCollector.
                   super___shared_ptr<celero::UserDefinedMeasurementCollector,_(__gnu_cxx::_Lock_policy)2>
                   ._M_refcount);
    bVar2 = std::__detail::operator==(&local_148,&local_150);
    if (bVar2) {
      std::allocator<char>::allocator();
      std::__cxx11::string::string((string *)&local_190,"---",&local_191);
      pvVar6 = std::vector<unsigned_long,_std::allocator<unsigned_long>_>::operator[]
                         (&this->columnWidths,(size_type)((long)&fieldName->_M_string_length + 1));
      PrintCenter(&local_170,&local_190,*pvVar6);
      std::operator<<((ostream *)&std::cout,(string *)&local_170);
      std::__cxx11::string::~string((string *)&local_170);
      std::__cxx11::string::~string((string *)&local_190);
      std::allocator<char>::~allocator((allocator<char> *)&local_191);
    }
    else {
      pmVar5 = std::
               unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_double,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_double>_>_>
               ::at((unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_double,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_double>_>_>
                     *)&udmCollector.
                        super___shared_ptr<celero::UserDefinedMeasurementCollector,_(__gnu_cxx::_Lock_policy)2>
                        ._M_refcount,local_140);
      dVar7 = *pmVar5;
      pvVar6 = std::vector<unsigned_long,_std::allocator<unsigned_long>_>::operator[]
                         (&this->columnWidths,(size_type)((long)&fieldName->_M_string_length + 1));
      PrintColumn_abi_cxx11_(&local_1b8,dVar7,2,*pvVar6);
      std::operator<<((ostream *)&std::cout,(string *)&local_1b8);
      std::__cxx11::string::~string((string *)&local_1b8);
    }
  }
  std::operator<<((ostream *)&std::cout,"\n");
  std::shared_ptr<celero::UserDefinedMeasurementCollector>::~shared_ptr
            ((shared_ptr<celero::UserDefinedMeasurementCollector> *)&__range1);
  std::
  unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_double,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_double>_>_>
  ::~unordered_map((unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_double,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_double>_>_>
                    *)&udmCollector.
                       super___shared_ptr<celero::UserDefinedMeasurementCollector,_(__gnu_cxx::_Lock_policy)2>
                       ._M_refcount);
  return;
}

Assistant:

void Printer::TableResult(std::shared_ptr<celero::ExperimentResult> x)
	{
		celero::console::SetConsoleColor(celero::console::ConsoleColor::Default);

		celero::console::ConsoleColor temp_color;

		// Slower than Baseline
		if(x->getBaselineMeasurement() > 1.0)
		{
			temp_color = celero::console::ConsoleColor::Yellow;
		}
		else if(x->getBaselineMeasurement() < 1.0)
		{
			temp_color = celero::console::ConsoleColor::Green;
		}
		else
		{
			temp_color = celero::console::ConsoleColor::Cyan;
		}

		celero::console::SetConsoleColor(temp_color);
		std::cout << PrintColumn(x->getBaselineMeasurement());
		celero::console::SetConsoleColor(celero::console::ConsoleColor::Default);

		celero::console::SetConsoleColor(temp_color);
		std::cout << PrintColumn(x->getUsPerCall());
		celero::console::SetConsoleColor(celero::console::ConsoleColor::Default);

		celero::console::SetConsoleColor(temp_color);
		std::cout << PrintColumn(x->getCallsPerSecond(), 2);
		celero::console::SetConsoleColor(celero::console::ConsoleColor::Default);

		celero::console::SetConsoleColor(temp_color);
		std::cout << PrintColumn(x->getRAM());
		celero::console::SetConsoleColor(celero::console::ConsoleColor::Default);

		std::unordered_map<std::string, double> udmValues;

		auto udmCollector = x->getUserDefinedMeasurements();
		for(const auto& entry : udmCollector->getAggregateValues())
		{
			udmValues[entry.first] = entry.second;
		}

		for(size_t i = 0; i < this->userDefinedColumns.size(); ++i)
		{
			const auto& fieldName = this->userDefinedColumns[i];

			if(udmValues.find(fieldName) == udmValues.end())
			{
				std::cout << PrintCenter("---", this->columnWidths[i + PrintConstants::NumberOfColumns]);
			}
			else
			{
				std::cout << PrintColumn(udmValues.at(fieldName), 2, this->columnWidths[i + PrintConstants::NumberOfColumns]);
			}
		}

		std::cout << "\n";
	}